

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O2

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create
               (BenchmarkContext *context)

{
  int64_t size;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  s;
  allocator local_51;
  string local_50;
  anon_class_8_1_54a39813 local_30;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  local_28;
  
  size = context->_iterationsCount;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::StorageArray(&local_28,size);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::Construct(&local_28);
  StorageArray<wigwag::signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>>
  ::
  ForEach<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create(benchmarks::BenchmarkContext&)::_lambda(wigwag::signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>&)_1_>
            ((StorageArray<wigwag::signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>>
              *)&local_28,(anon_class_1_0_00000001 *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"signal",(allocator *)&local_30);
  (*context->_vptr_BenchmarkContext[2])(context,&local_50,size);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"destroy",&local_51);
  local_30.s = &local_28;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_50,size,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  ::~StorageArray(&local_28);
  return;
}

Assistant:

static void Create(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<SignalType> s(n);

            s.Construct();
            s.ForEach([](SignalType& s){ ConnectionType(s.connect(SignalsDesc_::MakeHandler())); s(); });
            context.MeasureMemory("signal", n);
            context.Profile("destroy", n, [&]{ s.Destruct(); });
        }